

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O3

void __thiscall Sphere::GetUV(Sphere *this,Vec3 *pos,float *u,float *v)

{
  float fVar1;
  float fVar2;
  
  fVar1 = atan2f(pos->e[2],pos->e[0]);
  fVar2 = asinf(pos->e[1]);
  *u = (fVar1 + 3.1415927) / -6.2831855 + 1.0;
  *v = (fVar2 + 1.5707964) / 3.1415927;
  return;
}

Assistant:

void	 
Sphere::GetUV(const Vec3& pos, float& u, float& v) const {
	float phi   = atan2(pos.z(), pos.x());
	float theta = asin(pos.y());
	u = 1.0f - (phi + M_PI) / (2.0f * M_PI);
	v = (theta + M_PI / 2.0f) / M_PI;
}